

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O3

Extension * __thiscall
google::protobuf::internal::ExtensionSet::MaybeNewRepeatedExtension
          (ExtensionSet *this,FieldDescriptor *descriptor)

{
  Arena *this_00;
  bool bVar1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar2;
  Extension *pEVar3;
  Extension *extension;
  Extension *local_28;
  FieldDescriptor *local_20;
  _func_void_FieldDescriptor_ptr *local_18;
  
  bVar1 = MaybeNewExtension(this,*(int *)(descriptor + 0x44),descriptor,&local_28);
  if (bVar1) {
    if (*(once_flag **)(descriptor + 0x30) != (once_flag *)0x0) {
      local_18 = FieldDescriptor::TypeOnceInit;
      local_20 = descriptor;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(descriptor + 0x30),&local_18,&local_20);
    }
    pEVar3 = local_28;
    local_28->type = (FieldType)descriptor[0x38];
    local_28->is_repeated = true;
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) {
      pRVar2 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)operator_new(0x18);
      (pRVar2->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
      (pRVar2->super_RepeatedPtrFieldBase).current_size_ = 0;
      (pRVar2->super_RepeatedPtrFieldBase).total_size_ = 0;
      (pRVar2->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
    }
    else {
      if (this_00->hooks_cookie_ != (void *)0x0) {
        Arena::OnArenaAllocation
                  (this_00,(type_info *)&RepeatedPtrField<google::protobuf::MessageLite>::typeinfo,
                   0x18);
      }
      pRVar2 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)ArenaImpl::AllocateAlignedAndAddCleanup
                            (&this_00->impl_,0x18,
                             arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                            );
      (pRVar2->super_RepeatedPtrFieldBase).arena_ = this_00;
      (pRVar2->super_RepeatedPtrFieldBase).current_size_ = 0;
      (pRVar2->super_RepeatedPtrFieldBase).total_size_ = 0;
      (pRVar2->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
      pEVar3 = local_28;
    }
    (pEVar3->field_0).repeated_string_value = pRVar2;
  }
  return local_28;
}

Assistant:

ExtensionSet::Extension* ExtensionSet::MaybeNewRepeatedExtension(
    const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(descriptor->number(), descriptor, &extension)) {
    extension->type = descriptor->type();
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), FieldDescriptor::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->repeated_message_value =
        Arena::CreateMessage<RepeatedPtrField<MessageLite> >(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED, MESSAGE);
  }
  return extension;
}